

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O1

void MAFSA_automaton_search_enumerate
               (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
               void *user_data,MAFSA_letter delim,MAFSA_automaton_string_handler fetcher)

{
  MAFSA_letter MVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  MAFSA_stack_struct local_70;
  MAFSA_letter *local_58;
  size_t local_50;
  size_t local_48;
  void *local_40;
  MAFSA_letter *local_38;
  
  if (sz_l != 0) {
    uVar8 = 0;
    local_58 = tmp;
    local_50 = sz_tmp;
    local_40 = user_data;
    local_38 = l;
    do {
      uVar5 = *ma->ptr_nodes;
      local_70.buffer = local_58;
      local_70.reserved = local_50;
      local_70.current = 0xffffffffffffffff;
      local_48 = uVar8;
      do {
        if (sz_l < (uVar8 & 0xffffffff)) break;
        uVar7 = uVar5 & 0x7fffffff;
        uVar2 = ma->ptr_links[uVar7];
        uVar6 = uVar7;
        while (uVar4 = 0, uVar2 != 0xff000000) {
          uVar6 = uVar6 + 1;
          if ((MAFSA_letter)(uVar2 >> 0x18) == delim) {
            uVar4 = uVar2 & 0xffffff;
            break;
          }
          uVar2 = ma->ptr_links[uVar6];
        }
        if (uVar4 != 0) {
          uVar3 = local_70.current + 1;
          if (uVar3 < local_70.reserved) {
            local_70.buffer[uVar3] = delim;
            local_70.current = uVar3;
          }
          enumerate(ma,ma->ptr_nodes[uVar4],&local_70,fetcher,local_40);
          if (-1 < local_70.current) {
            local_70.current = local_70.current - 1;
          }
        }
        MVar1 = local_38[uVar8 & 0xffffffff];
        uVar3 = local_70.current + 1;
        if (uVar3 < local_70.reserved) {
          local_70.buffer[uVar3] = MVar1;
          local_70.current = uVar3;
        }
        uVar3 = 0;
        uVar2 = ma->ptr_links[uVar7];
        while (uVar2 != 0xff000000) {
          uVar7 = uVar7 + 1;
          if (MVar1 == (MAFSA_letter)(uVar2 >> 0x18)) {
            uVar3 = (ulong)(uVar2 & 0xffffff);
            break;
          }
          uVar2 = ma->ptr_links[uVar7];
        }
        if ((int)uVar3 != 0) {
          uVar5 = ma->ptr_nodes[uVar3];
        }
        uVar8 = (ulong)((int)uVar8 + 1);
      } while ((int)uVar3 != 0);
      uVar8 = local_48 + 1;
    } while (uVar8 != sz_l);
  }
  return;
}

Assistant:

extern void MAFSA_automaton_search_enumerate(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l, MAFSA_letter *tmp,
    size_t sz_tmp, void *user_data, MAFSA_letter delim, MAFSA_automaton_string_handler fetcher)
{
    ssize_t cur_pos;

    for (cur_pos = 0; cur_pos < sz_l; ++cur_pos)
    {
        uint32_t i = cur_pos;
        uint32_t current = ma->ptr_nodes[0];
        uint32_t where = 0;

        struct MAFSA_stack_struct tmp_stack;

        tmp_stack.buffer   = tmp;
        tmp_stack.reserved = sz_tmp;
        tmp_stack.current  = -1;

        while (i <= sz_l)
        {
            MAFSA_letter label;

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, delim)))
            {
                stack_push(&tmp_stack, delim);
                enumerate(ma, ma->ptr_nodes[where], &tmp_stack, fetcher, user_data);
                stack_pop(&tmp_stack);
            }

            label = l[i++];
            stack_push(&tmp_stack, label);

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
            {
                current = ma->ptr_nodes[where];
            }
            else
            {
                break;
            }
        }
    }
}